

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O2

void __thiscall
MeshDenoisingViaL0Minimization::calculateAreaBasedEdgeOperator
          (MeshDenoisingViaL0Minimization *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *area_based_edge_operator,
          vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
          *edge_vertex_handle,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *coef)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  pointer pVVar14;
  HalfedgeHandle _heh;
  EdgeHandle EVar15;
  bool bVar16;
  int iVar17;
  VertexHandle _vh;
  BaseHandle _vh_00;
  HalfedgeHandle HVar18;
  BaseHandle _vh_01;
  BaseHandle _vh_02;
  FaceHandle FVar19;
  FaceHandle FVar20;
  size_type sVar21;
  Point *pPVar22;
  long lVar23;
  Scalar SVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  EdgeIter EVar30;
  undefined1 auStack_128 [8];
  vector<double,_std::allocator<double>_> face_area;
  undefined1 auStack_e8 [8];
  vector<double,_std::allocator<double>_> temp_coef;
  vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> vertex_handle;
  undefined1 local_60 [8];
  EdgeIter e_it;
  
  auStack_128 = (undefined1  [8])0x0;
  face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  MeshDenoisingBase::getFaceArea
            (&this->super_MeshDenoisingBase,mesh,
             (vector<double,_std::allocator<double>_> *)auStack_128);
  iVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       + 0x20))(mesh);
  auStack_e8 = (undefined1  [8])0x0;
  temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (area_based_edge_operator,(long)iVar17,(value_type *)auStack_e8);
  temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)auStack_e8,4,
             (value_type_conflict2 *)
             &temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(allocator_type *)local_60);
  sVar21 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       + 0x20))(mesh);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(coef,sVar21,(value_type *)auStack_e8);
  std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::vector
            ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
             &temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,4,(allocator_type *)local_60);
  sVar21 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       + 0x20))(mesh);
  std::
  vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
  ::resize(edge_vertex_handle,sVar21,
           (value_type *)
           &temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  _local_60 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)mesh);
  while( true ) {
    EVar30 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
    if ((BaseHandle)e_it.mesh_._0_4_ == EVar30.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
        local_60 == (undefined1  [8])EVar30.mesh_) break;
    bVar16 = OpenMesh::PolyConnectivity::is_boundary
                       ((PolyConnectivity *)mesh,(EdgeHandle)e_it.mesh_._0_4_);
    if (!bVar16) {
      EVar15.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)e_it.mesh_._0_4_;
      SVar24 = OpenMesh::
               PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
               ::calc_edge_length((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                   *)mesh,(EdgeHandle)e_it.mesh_._0_4_);
      _heh.super_BaseHandle.idx_ = (BaseHandle)(e_it.mesh_._0_4_ * 2);
      _vh = OpenMesh::ArrayKernel::from_vertex_handle((ArrayKernel *)mesh,_heh);
      _vh_00.idx_ = (int)OpenMesh::ArrayKernel::to_vertex_handle((ArrayKernel *)mesh,_heh);
      HVar18 = OpenMesh::ArrayKernel::next_halfedge_handle((ArrayKernel *)mesh,_heh);
      _vh_01.idx_ = (int)OpenMesh::ArrayKernel::to_vertex_handle((ArrayKernel *)mesh,HVar18);
      HVar18 = OpenMesh::ArrayKernel::next_halfedge_handle
                         ((ArrayKernel *)mesh,(HalfedgeHandle)((uint)_heh.super_BaseHandle.idx_ | 1)
                         );
      _vh_02.idx_ = (int)OpenMesh::ArrayKernel::to_vertex_handle((ArrayKernel *)mesh,HVar18);
      FVar19 = OpenMesh::ArrayKernel::face_handle((ArrayKernel *)mesh,_heh);
      FVar20 = OpenMesh::ArrayKernel::face_handle
                         ((ArrayKernel *)mesh,(HalfedgeHandle)((uint)_heh.super_BaseHandle.idx_ | 1)
                         );
      dVar1 = *(double *)((long)auStack_128 + (long)(int)FVar19.super_BaseHandle.idx_ * 8);
      dVar2 = *(double *)((long)auStack_128 + (long)(int)FVar20.super_BaseHandle.idx_ * 8);
      pPVar22 = OpenMesh::
                AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         *)mesh,(VertexHandle)_vh.super_BaseHandle.idx_);
      dVar3 = (pPVar22->super_VectorDataT<double,_3>).values_[0];
      dVar4 = (pPVar22->super_VectorDataT<double,_3>).values_[1];
      e_it._8_8_ = (pPVar22->super_VectorDataT<double,_3>).values_[2];
      pPVar22 = OpenMesh::
                AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         *)mesh,(VertexHandle)_vh_02.idx_);
      dVar5 = (pPVar22->super_VectorDataT<double,_3>).values_[0];
      dVar6 = (pPVar22->super_VectorDataT<double,_3>).values_[1];
      dVar7 = (pPVar22->super_VectorDataT<double,_3>).values_[2];
      pPVar22 = OpenMesh::
                AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         *)mesh,(VertexHandle)_vh_00.idx_);
      dVar8 = (pPVar22->super_VectorDataT<double,_3>).values_[0];
      dVar9 = (pPVar22->super_VectorDataT<double,_3>).values_[1];
      dVar10 = (pPVar22->super_VectorDataT<double,_3>).values_[2];
      pPVar22 = OpenMesh::
                AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         *)mesh,(VertexHandle)_vh_01.idx_);
      dVar11 = (pPVar22->super_VectorDataT<double,_3>).values_[0];
      dVar12 = (pPVar22->super_VectorDataT<double,_3>).values_[1];
      dVar13 = (pPVar22->super_VectorDataT<double,_3>).values_[2];
      dVar27 = dVar3 - dVar8;
      dVar26 = dVar4 - dVar9;
      dVar25 = (double)e_it._8_8_ - dVar10;
      dVar28 = dVar1 + dVar2;
      dVar29 = SVar24 * SVar24 * dVar28;
      *(double *)auStack_e8 =
           (((dVar10 - dVar13) * dVar25 +
            (dVar9 - dVar12) * dVar26 + (dVar8 - dVar11) * dVar27 + 0.0) * dVar2 -
           ((dVar7 - dVar10) * dVar25 + (dVar6 - dVar9) * dVar26 + (dVar5 - dVar8) * dVar27 + 0.0) *
           dVar1) / dVar29;
      *(double *)((long)auStack_e8 + 8) = dVar1 / dVar28;
      *(double *)((long)auStack_e8 + 0x10) =
           ((((double)e_it._8_8_ - dVar13) * dVar25 +
            (dVar4 - dVar12) * dVar26 + (dVar3 - dVar11) * dVar27 + 0.0) * -dVar2 -
           (dVar25 * ((double)e_it._8_8_ - dVar7) +
           dVar26 * (dVar4 - dVar6) + dVar27 * (dVar3 - dVar5) + 0.0) * dVar1) / dVar29;
      *(double *)((long)auStack_e8 + 0x18) = dVar2 / dVar28;
      lVar23 = (long)(int)EVar15.super_BaseHandle.idx_;
      std::vector<double,_std::allocator<double>_>::operator=
                ((coef->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar23,
                 (vector<double,_std::allocator<double>_> *)auStack_e8);
      *(BaseHandle *)
       temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage = _vh.super_BaseHandle.idx_;
      ((BaseHandle *)
      ((long)temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 4))->idx_ = _vh_02.idx_;
      ((BaseHandle *)
      (temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage + 1))->idx_ = _vh_00.idx_;
      ((BaseHandle *)
      ((long)temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 0xc))->idx_ = _vh_01.idx_;
      std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::operator=
                ((edge_vertex_handle->
                 super__Vector_base<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar23,
                 (vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                 &temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      dVar1 = *(double *)auStack_e8;
      dVar2 = *(double *)((long)auStack_e8 + 8);
      dVar25 = *(double *)((long)auStack_e8 + 0x10);
      dVar26 = *(double *)((long)auStack_e8 + 0x18);
      pVVar14 = (area_based_edge_operator->
                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pVVar14[lVar23].super_VectorDataT<double,_3>.values_[0] =
           dVar11 * dVar26 + dVar8 * dVar25 + dVar5 * dVar2 + dVar3 * dVar1;
      pVVar14[lVar23].super_VectorDataT<double,_3>.values_[1] =
           dVar12 * dVar26 + dVar9 * dVar25 + dVar6 * dVar2 + dVar4 * dVar1;
      pVVar14[lVar23].super_VectorDataT<double,_3>.values_[2] =
           dVar13 * dVar26 + dVar10 * dVar25 + dVar7 * dVar2 + (double)e_it._8_8_ * dVar1;
    }
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                  *)local_60,0);
  }
  std::_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::~_Vector_base
            ((_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
             &temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)auStack_e8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)auStack_128);
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::calculateAreaBasedEdgeOperator(TriMesh &mesh,
                                                                    std::vector<TriMesh::Point> &area_based_edge_operator,
                                                                    std::vector< std::vector<TriMesh::VertexHandle> > &edge_vertex_handle,
                                                                    std::vector< std::vector<double> > &coef)
{
    std::vector<double> face_area;
    getFaceArea(mesh, face_area);

    area_based_edge_operator.resize((int)mesh.n_edges(), TriMesh::Point(0.0, 0.0, 0.0));
    std::vector<double> temp_coef(4, 0.0);
    coef.resize(mesh.n_edges(), temp_coef);
    std::vector<TriMesh::VertexHandle> vertex_handle(4);
    edge_vertex_handle.resize(mesh.n_edges(), vertex_handle);
    for(TriMesh::EdgeIter e_it = mesh.edges_begin(); e_it != mesh.edges_end(); e_it++)
    {
        if(!mesh.is_boundary(*e_it))
        {
            int index = e_it->idx();
            double edge_length = mesh.calc_edge_length(*e_it);

            // get four vertices correspond to edge *e_it
            TriMesh::HalfedgeHandle he = mesh.halfedge_handle(*e_it, 0);
            TriMesh::VertexHandle v1 = mesh.from_vertex_handle(he);
            TriMesh::VertexHandle v3 = mesh.to_vertex_handle(he);
            TriMesh::HalfedgeHandle he_next = mesh.next_halfedge_handle(he);
            TriMesh::VertexHandle v4 = mesh.to_vertex_handle(he_next);

            TriMesh::HalfedgeHandle he_oppo = mesh.opposite_halfedge_handle(he);
            TriMesh::HalfedgeHandle he_oppo_next = mesh.next_halfedge_handle(he_oppo);
            TriMesh::VertexHandle v2 = mesh.to_vertex_handle(he_oppo_next);

            // two faces
            TriMesh::FaceHandle f1 = mesh.face_handle(he);
            TriMesh::FaceHandle f2 = mesh.face_handle(he_oppo);

            // the area of two faces correspond to edge *e_it
            double area134 = face_area[f1.idx()];
            double area123 = face_area[f2.idx()];
            double totalArea = area123 + area134;

            TriMesh::Point p1 = mesh.point(v1);
            TriMesh::Point p2 = mesh.point(v2);
            TriMesh::Point p3 = mesh.point(v3);
            TriMesh::Point p4 = mesh.point(v4);

            TriMesh::Point p12 = p1 - p2;
            TriMesh::Point p13 = p1 - p3;
            TriMesh::Point p14 = p1 - p4;
            TriMesh::Point p23 = p2 - p3;
            TriMesh::Point p34 = p3 - p4;

            // calc coefficient
            temp_coef[0] = (area123 * (p34 | p13) - area134 * (p13 | p23)) / (edge_length * edge_length * totalArea);
            temp_coef[1] = area134 / totalArea;
            temp_coef[2] = (-area123 * (p13 | p14) - area134 * (p12 | p13)) / (edge_length * edge_length * totalArea);
            temp_coef[3] = area123 / totalArea;
            coef[index] = temp_coef;

            vertex_handle[0] = v1;
            vertex_handle[1] = v2;
            vertex_handle[2] = v3;
            vertex_handle[3] = v4;
            edge_vertex_handle[index] = vertex_handle;

            // calc area-based edge operator
            TriMesh::Point pt = p1 * temp_coef[0] + p2 * temp_coef[1] + p3 * temp_coef[2] + p4 * temp_coef[3];
            area_based_edge_operator[index] = pt;
        }
    }
}